

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifierUtil.cpp
# Opt level: O3

void vkt::texture::util::wrapCubemapEdge
               (IVec2 *coord,IVec2 *size,int faceNdx,IVec2 *newCoord,int *newFaceNdx)

{
  ulong uVar1;
  undefined8 uVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  
  if (coord->m_data[1] < 0) {
    lVar4 = 0;
  }
  else {
    lVar4 = 1;
    if (coord->m_data[0] < 1) {
      lVar4 = (ulong)(coord->m_data[1] == 0) + 2;
    }
  }
  lVar5 = (long)faceNdx * 0x10;
  uVar1 = *(ulong *)((anonymous_namespace)::edgeFactors +
                    (long)*(int *)((anonymous_namespace)::adjacentEdges + lVar4 * 4 + lVar5) * 8);
  uVar2 = *(undefined8 *)size->m_data;
  iVar6 = (&(anonymous_namespace)::edgeComponent)[lVar4];
  if (*(int *)((anonymous_namespace)::adjacentEdgeDirs + lVar4 * 4 + lVar5) < 1) {
    iVar6 = ~coord->m_data[iVar6] + size->m_data[iVar6];
  }
  else {
    iVar6 = coord->m_data[iVar6];
  }
  iVar3 = (&(anonymous_namespace)::edgeComponent)
          [*(int *)((anonymous_namespace)::adjacentEdges + lVar4 * 4 + lVar5)];
  newCoord->m_data[iVar3] = iVar6;
  newCoord->m_data[1 - iVar3] = 0;
  *(ulong *)newCoord->m_data =
       CONCAT44((int)((ulong)*(undefined8 *)newCoord->m_data >> 0x20) +
                (int)((uVar1 >> 0x20) * (ulong)((int)((ulong)uVar2 >> 0x20) - 1)),
                (int)*(undefined8 *)newCoord->m_data +
                (int)((ulong)((int)uVar2 - 1) * (uVar1 & 0xffffffff)));
  *newFaceNdx = *(int *)((anonymous_namespace)::adjacentFaces + lVar4 * 4 + lVar5);
  return;
}

Assistant:

void wrapCubemapEdge (const IVec2&	coord,
					  const IVec2&	size,
					  const int		faceNdx,
					  IVec2&		newCoord,
					  int&			newFaceNdx)
{
	int edgeNdx = -1;

	if (coord[1] < 0)
	{
		edgeNdx = 0;
	}
	else if (coord[0] > 0)
	{
		edgeNdx = 1;
	}
	else if (coord[1] > 0)
	{
		edgeNdx = 2;
	}
	else
	{
		edgeNdx = 3;
	}

	const int		adjacentEdgeNdx = adjacentEdges[faceNdx][edgeNdx];
	const IVec2		edgeFactor		= IVec2(edgeFactors[adjacentEdgeNdx][0],
											edgeFactors[adjacentEdgeNdx][1]);
	const IVec2		edgeOffset		= edgeFactor * (size - IVec2(1));

	if (adjacentEdgeDirs[faceNdx][edgeNdx] > 0)
	{
		newCoord[edgeComponent[adjacentEdgeNdx]] = coord[edgeComponent[edgeNdx]];
	}
	else
	{
		newCoord[edgeComponent[adjacentEdgeNdx]] =
		    size[edgeComponent[edgeNdx]] - coord[edgeComponent[edgeNdx]] - 1;
	}

	newCoord[1 - edgeComponent[adjacentEdgeNdx]] = 0;
	newCoord += edgeOffset;

	newFaceNdx = adjacentFaces[faceNdx][edgeNdx];
}